

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssemblyCommand.cpp
# Opt level: O0

void onlyLeftProcessMemoryTemps
               (AssemblyCommands *newAssemblyCommands,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               *spilledToOffset,CTemp *beginSP,shared_ptr<AssemblyCode::AssemblyCommand> *thisShared
               ,CTemp *leftOperand,bool shouldLoadLeft,bool shouldStoreLeft)

{
  bool bVar1;
  pointer ppVar2;
  undefined1 local_f8 [16];
  CTemp local_e8;
  undefined1 local_c8 [24];
  CTemp leftTemp;
  CTemp local_80;
  _Self local_60;
  iterator leftFind;
  string leftName;
  bool shouldStoreLeft_local;
  bool shouldLoadLeft_local;
  CTemp *leftOperand_local;
  shared_ptr<AssemblyCode::AssemblyCommand> *thisShared_local;
  CTemp *beginSP_local;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *spilledToOffset_local;
  AssemblyCommands *newAssemblyCommands_local;
  
  IRT::CTemp::ToString_abi_cxx11_((CTemp *)&leftFind);
  IRT::CTemp::ToString_abi_cxx11_(&local_80);
  local_60._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
       ::find(spilledToOffset,&local_80.name);
  std::__cxx11::string::~string((string *)&local_80);
  leftTemp._24_8_ =
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
       ::end(spilledToOffset);
  bVar1 = std::operator!=(&local_60,(_Self *)&leftTemp.field_0x18);
  if (bVar1) {
    IRT::CTemp::CTemp((CTemp *)(local_c8 + 0x10));
    if (shouldLoadLeft) {
      ppVar2 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
               ::operator->(&local_60);
      createLoad((CTemp *)local_c8,(int)local_c8 + 0x10,(CTemp *)(ulong)(uint)ppVar2->second);
      std::
      vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,_std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>_>_>
      ::push_back(newAssemblyCommands,(value_type *)local_c8);
      std::shared_ptr<AssemblyCode::AssemblyCommand>::~shared_ptr
                ((shared_ptr<AssemblyCode::AssemblyCommand> *)local_c8);
    }
    IRT::CTemp::ToString_abi_cxx11_(&local_e8);
    std::__cxx11::string::operator=((string *)&leftFind,(string *)&local_e8);
    std::__cxx11::string::~string((string *)&local_e8);
    std::
    vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,_std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>_>_>
    ::push_back(newAssemblyCommands,thisShared);
    if (shouldStoreLeft) {
      ppVar2 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
               ::operator->(&local_60);
      createStore((CTemp *)local_f8,(int)local_c8 + 0x10,(CTemp *)(ulong)(uint)ppVar2->second);
      std::
      vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,_std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>_>_>
      ::push_back(newAssemblyCommands,(value_type *)local_f8);
      std::shared_ptr<AssemblyCode::AssemblyCommand>::~shared_ptr
                ((shared_ptr<AssemblyCode::AssemblyCommand> *)local_f8);
    }
    IRT::CTemp::~CTemp((CTemp *)(local_c8 + 0x10));
  }
  else {
    std::
    vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,_std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>_>_>
    ::push_back(newAssemblyCommands,thisShared);
  }
  IRT::CTemp::setName(leftOperand,(string *)&leftFind);
  std::__cxx11::string::~string((string *)&leftFind);
  return;
}

Assistant:

void onlyLeftProcessMemoryTemps(AssemblyCommands &newAssemblyCommands,
                                 std::map<std::string, int> &spilledToOffset,
                                 IRT::CTemp& beginSP,
                                 std::shared_ptr<AssemblyCode::AssemblyCommand> thisShared,
                                 IRT::CTemp& leftOperand,
                                 bool shouldLoadLeft = true,
                                 bool shouldStoreLeft = true) {

    std::string leftName = leftOperand.ToString();

    auto leftFind = spilledToOffset.find(leftOperand.ToString());

    if (leftFind != spilledToOffset.end()) {
        IRT::CTemp leftTemp;
        if (shouldLoadLeft) {
            newAssemblyCommands.push_back( createLoad( leftTemp, leftFind->second, beginSP ));
        }
        leftName = leftTemp.ToString();

        newAssemblyCommands.push_back(thisShared);

        if (shouldStoreLeft) {
            newAssemblyCommands.push_back( createStore( leftTemp, leftFind->second, beginSP ));
        }
    } else {
        newAssemblyCommands.push_back(thisShared);
    }

    leftOperand.setName(leftName);
}